

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void printAnswerForDebug(myRep *rep)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  char *__filename;
  FILE *__stream;
  ostream *this;
  pointer pRVar5;
  int local_4c;
  uint local_48;
  int j;
  int t;
  int len;
  FILE *outFile;
  char *filename;
  _List_node_base *local_28;
  int local_1c;
  iterator iStack_18;
  int k;
  iterator it1;
  myRep *rep_local;
  
  it1._M_node = (_List_node_base *)rep;
  std::_List_iterator<Rep>::_List_iterator(&stack0xffffffffffffffe8);
  local_1c = 0;
  local_28 = (_List_node_base *)std::__cxx11::list<Rep,_std::allocator<Rep>_>::begin(it1._M_node);
  iStack_18 = (iterator)local_28;
  while( true ) {
    filename = (char *)std::__cxx11::list<Rep,_std::allocator<Rep>_>::end
                                 ((list<Rep,_std::allocator<Rep>_> *)it1._M_node);
    bVar4 = std::operator!=(&stack0xffffffffffffffe8,(_Self *)&filename);
    if (!bVar4) {
      return;
    }
    __filename = catStrIntStr(draftAddress,"rep",local_1c,".txt");
    __stream = fopen(__filename,"w");
    if (__stream == (FILE *)0x0) break;
    pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
    fprintf(__stream,"iterator=%d\n",(ulong)(uint)pRVar5->iterator);
    pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
    dVar1 = *pRVar5->Cost;
    pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
    fprintf(__stream,"cost0 =%10.3f cost1 =%10.3f\n",dVar1,pRVar5->Cost[1]);
    pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
    iVar3 = pRVar5->sizeOfAddO_origin;
    local_48 = 0;
    for (local_4c = 0; local_4c < iVar3; local_4c = local_4c + 3) {
      fprintf(__stream,"%4d ",(ulong)local_48);
      switch((int)local_48 % 4) {
      case 0:
        fprintf(__stream," N  ");
        break;
      case 1:
        fprintf(__stream," CA ");
        break;
      case 2:
        fprintf(__stream," C  ");
        break;
      case 3:
        fprintf(__stream," O  ");
      }
      pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
      dVar1 = pRVar5->addO_origin[local_4c];
      pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
      dVar2 = pRVar5->addO_origin[local_4c + 1];
      pRVar5 = std::_List_iterator<Rep>::operator->(&stack0xffffffffffffffe8);
      fprintf(__stream,"%8.3f %8.3f %8.3f\n",dVar1,dVar2,pRVar5->addO_origin[local_4c + 2]);
      local_48 = local_48 + 1;
    }
    local_1c = local_1c + 1;
    fclose(__stream);
    std::_List_iterator<Rep>::operator++(&stack0xffffffffffffffe8,0);
  }
  this = std::operator<<((ostream *)&std::cout,"Can\'t print rep answer");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

void printAnswerForDebug(myRep & rep){
    myRep ::iterator it1;
    int k=0;
    for (it1=rep.begin(); it1!= rep.end(); it1++){
        char *filename;
        filename = catStrIntStr(draftAddress, "rep", k, ".txt");
        FILE *outFile;
        outFile = fopen(filename, "w");
        if (outFile == NULL) {
            cout << "Can't print rep answer" << endl;
            exit(-1);
        }
        fprintf(outFile, "iterator=%d\n",it1->iterator);
        fprintf(outFile, "cost0 =%10.3f cost1 =%10.3f\n", it1->Cost[0], it1->Cost[1]);
        int len = it1->sizeOfAddO_origin;
        int t=0;
        for (int j=0; j<len; j+=3){
            fprintf(outFile, "%4d ", t);
            switch (t % 4){
                case 0: fprintf(outFile, " N  "); break;
                case 1: fprintf(outFile, " CA "); break;
                case 2: fprintf(outFile, " C  "); break;
                case 3: fprintf(outFile, " O  "); break;
            }
            fprintf(outFile, "%8.3f %8.3f %8.3f\n",
                    it1->addO_origin[j], it1->addO_origin[j+1], it1->addO_origin[j+2]);
            t++;
        }
        k++;
        fclose(outFile);
    }
}